

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QString * __thiscall QWidget::styleSheet(QString *__return_storage_ptr__,QWidget *this)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (lVar1 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)(lVar1 + 0x48));
  }
  return __return_storage_ptr__;
}

Assistant:

QString QWidget::styleSheet() const
{
    Q_D(const QWidget);
    if (!d->extra)
        return QString();
    return d->extra->styleSheet;
}